

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O3

void text_displace(t_gobj *z,_glist *glist,int dx,int dy)

{
  short *psVar1;
  int iVar2;
  _rtext *x;
  char *tag;
  int width2;
  int in_R8D;
  
  *(short *)&z[2].g_next = *(short *)&z[2].g_next + (short)dx;
  psVar1 = (short *)((long)&z[2].g_next + 2);
  *psVar1 = *psVar1 + (short)dy;
  width2 = dy;
  iVar2 = glist_isvisible(glist);
  if (iVar2 != 0) {
    x = glist_findrtext(glist,(t_text *)z);
    rtext_displace(x,dx * glist->gl_zoom,dy * glist->gl_zoom);
    tag = rtext_gettag(x);
    rtext_width(x);
    rtext_height(x);
    text_drawborder((t_text *)z,glist,tag,width2,in_R8D,0);
    canvas_fixlinesfor(glist,(t_text *)z);
    return;
  }
  return;
}

Assistant:

static void text_displace(t_gobj *z, t_glist *glist,
    int dx, int dy)
{
    t_text *x = (t_text *)z;
    x->te_xpix += dx;
    x->te_ypix += dy;
    if (glist_isvisible(glist))
    {
        t_rtext *y = glist_findrtext(glist, x);
        rtext_displace(y, glist->gl_zoom * dx, glist->gl_zoom * dy);
        text_drawborder(x, glist, rtext_gettag(y),
            rtext_width(y), rtext_height(y), 0);
        canvas_fixlinesfor(glist, x);
    }
}